

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_long_const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_long>
          (ExpressionLhs<unsigned_long_const&> *this,unsigned_long *rhs)

{
  ResultBuilder *pRVar1;
  Catch *this_00;
  OfType OVar2;
  unsigned_long in_RDX;
  unsigned_long value;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  this_00 = (Catch *)**(undefined8 **)(this + 8);
  OVar2 = ExpressionFailed;
  if (this_00 == (Catch *)*rhs) {
    OVar2 = Ok;
  }
  (pRVar1->m_data).resultType = OVar2;
  Catch::toString_abi_cxx11_(&local_38,this_00,in_RDX);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)*rhs,value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }